

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvt2triphone.c
# Opt level: O3

int cvt2triphone_mmie(acmod_set_t *acmod_set,acmod_id_t *phone,acmod_id_t *l_phone,
                     acmod_id_t *r_phone,char *btw_mark,uint32 n_phone)

{
  byte bVar1;
  uint uVar2;
  acmod_id_t aVar3;
  acmod_id_t aVar4;
  uint32 uVar5;
  uint32 uVar6;
  acmod_id_t aVar7;
  word_posn_t wVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  uint id;
  ulong uVar14;
  word_posn_t local_68;
  
  aVar4 = acmod_set_name2id(acmod_set,"SIL");
  uVar5 = acmod_set_n_multi(acmod_set);
  if (uVar5 == 0) {
    if (cvt2triphone_mmie_spoke_my_peace == '\0') {
      fflush(_stdout);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
              ,0x13b,"no multiphones defined, no conversion done\n");
      cvt2triphone_mmie_spoke_my_peace = '\x01';
      fflush(_stderr);
    }
  }
  else {
    uVar5 = acmod_set_has_attrib(acmod_set,*l_phone,"filler");
    if (uVar5 != 0) {
      *l_phone = aVar4;
    }
    uVar5 = acmod_set_has_attrib(acmod_set,*r_phone,"filler");
    if (uVar5 != 0) {
      *r_phone = aVar4;
    }
    uVar13 = (uint)(byte)*l_phone;
    if (n_phone - 1 == 0) {
      uVar9 = 0;
      local_68 = WORD_POSN_END;
    }
    else {
      uVar9 = (ulong)(n_phone - 1);
      local_68 = WORD_POSN_END;
      uVar14 = 0;
      do {
        uVar2 = phone[uVar14 + 1];
        uVar5 = acmod_set_has_attrib(acmod_set,uVar2 & 0xff,"filler");
        aVar7 = phone[uVar14];
        id = (uint)(byte)aVar7;
        local_68 = btw_posn(btw_mark[uVar14],local_68);
        uVar6 = acmod_set_has_attrib(acmod_set,id,"filler");
        aVar3 = aVar4;
        if (uVar6 == 0) {
          if (uVar5 != 0) {
            uVar2 = aVar4;
          }
          aVar7 = acmod_set_tri2id(acmod_set,(uint)(byte)aVar7,uVar13 & 0xff,uVar2 & 0xff,local_68);
          aVar3 = id;
          if (aVar7 == 0xffffffff) {
            wVar8 = WORD_POSN_BEGIN;
            do {
              aVar7 = acmod_set_tri2id(acmod_set,id,uVar13 & 0xff,uVar2 & 0xff,wVar8);
              if (aVar7 != 0xffffffff) goto LAB_0011ba57;
              wVar8 = wVar8 + WORD_POSN_END;
            } while (wVar8 != WORD_POSN_UNDEFINED);
          }
          else {
LAB_0011ba57:
            phone[uVar14] = aVar7;
          }
        }
        uVar13 = aVar3;
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar9);
    }
    bVar1 = (byte)phone[uVar9];
    aVar4 = *r_phone;
    uVar5 = acmod_set_has_attrib(acmod_set,(uint)bVar1,"filler");
    if (uVar5 == 0) {
      if (btw_mark[uVar9] == '\0') {
        __assert_fail("btw_mark[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                      ,0x17c,
                      "int cvt2triphone_mmie(acmod_set_t *, acmod_id_t *, acmod_id_t *, acmod_id_t *, char *, uint32)"
                     );
      }
      wVar8 = btw_posn(btw_mark[uVar9],local_68);
      aVar7 = acmod_set_tri2id(acmod_set,(uint)bVar1,uVar13 & 0xff,(uint)(byte)aVar4,wVar8);
      if (aVar7 == 0xffffffff) {
        pcVar10 = acmod_set_id2name(acmod_set,(uint)bVar1);
        pcVar11 = acmod_set_id2name(acmod_set,uVar13 & 0xff);
        pcVar12 = acmod_set_id2name(acmod_set,(uint)(byte)aVar4);
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
                ,0x189,"Missing triphone, (%s %s %s %c), left as CI phone",pcVar10,pcVar11,pcVar12,
                (ulong)(uint)(int)"besiu"[wVar8]);
      }
      else {
        phone[uVar9] = aVar7;
      }
    }
  }
  return 0;
}

Assistant:

int
cvt2triphone_mmie(acmod_set_t *acmod_set,
		  acmod_id_t *phone,
		  acmod_id_t *l_phone,
		  acmod_id_t *r_phone,
		  char *btw_mark,
		  uint32 n_phone)
{
  uint32 i;
  ci_acmod_id_t b = (ci_acmod_id_t)NO_ACMOD;
  ci_acmod_id_t l = (ci_acmod_id_t)NO_ACMOD;
  ci_acmod_id_t r = (ci_acmod_id_t)NO_ACMOD;
  acmod_id_t tri_id;
  word_posn_t posn;
  static int spoke_my_peace = FALSE;
  acmod_id_t sil = acmod_set_name2id(acmod_set, "SIL");
  char *word_posn_map = WORD_POSN_CHAR_MAP;

  if (acmod_set_n_multi(acmod_set) == 0) {
    /* nothing to do */
    
    if (!spoke_my_peace) {
      fflush(stdout);
      E_INFO("no multiphones defined, no conversion done\n");
      spoke_my_peace = TRUE;
      fflush(stderr);
    }
    return S3_SUCCESS;
  }
  
  /* if left phone and right phone is filler */
  if (acmod_set_has_attrib(acmod_set, *l_phone, "filler"))
    *l_phone = sil;
  if (acmod_set_has_attrib(acmod_set, *r_phone, "filler"))
    *r_phone = sil;
  
  for (i = 0, l = *l_phone, r = sil, posn = WORD_POSN_END; i < n_phone-1; i++) {
    /* get new right context */
    r = phone[i+1];
    if (acmod_set_has_attrib(acmod_set, r, "filler"))
      r = sil;
    
    b = phone[i];
    
    /* determine between word position {begin|start|single} */
    posn = btw_posn(btw_mark[i], posn);
    
    if (!acmod_set_has_attrib(acmod_set, b, "filler")) {
      tri_id = acmod_set_tri2id(acmod_set,
				b, l, r, posn);
      if (tri_id != NO_ACMOD) {
	/* got good triphone, so replace CI w/ tri */
	phone[i] = tri_id;
      }
      else {
	/* Try to back off to other word positions */
	int j;
	
	for (j = 0; j < N_WORD_POSN; ++j) {
	  tri_id = acmod_set_tri2id(acmod_set,
				    b, l, r, j);
	  if (tri_id != NO_ACMOD) {
	    phone[i] = tri_id;
	    break;
	  }
	}
      }
    }
    else {
      /* phone[i] is a filler phone, so just leave it as is */
      /* Change b to SIL for triphone context purposes */
      b = sil;
    }
    
    /* Set next left context is the current base phone (where filler phones
     * are mapped to SIL) */
    l = b;
  }
  
  b = phone[i];
  r = *r_phone;
  
  /* At this point, b is the right context of
   * the next to last phone.  Typically, this
   * is sil or some other filler phone. */
  
  if (!acmod_set_has_attrib(acmod_set, b, "filler")) {
    
    assert( btw_mark[i] );
    
    posn = btw_posn(btw_mark[i], posn);
    
    tri_id = acmod_set_tri2id(acmod_set,
			      b, l, r, posn);
    if (tri_id != NO_ACMOD)
      phone[i] = tri_id;
    else {
      E_WARN("Missing triphone, (%s %s %s %c), left as CI phone",
	     acmod_set_id2name(acmod_set, b),
	     acmod_set_id2name(acmod_set, l),
	     acmod_set_id2name(acmod_set, r),
	     word_posn_map[(int)posn]);
    }
  }
  
  return S3_SUCCESS;
}